

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

Node * __thiscall
google::protobuf::Map<int,_proto2_unittest::Proto2MapEnum>::CloneFromOther
          (Map<int,_proto2_unittest::Proto2MapEnum> *this,
          Map<int,_proto2_unittest::Proto2MapEnum> *other)

{
  NodeBase *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  const_iterator __begin0;
  
  internal::UntypedMapBase::begin(&__begin0.super_UntypedMapIterator,(UntypedMapBase *)other);
  pNVar3 = (Node *)0x0;
  while (pNVar1 = __begin0.super_UntypedMapIterator.node_,
        __begin0.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
    pNVar2 = (Node *)internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x10);
    *(NodeBase **)&(pNVar2->kv).first = pNVar1[1].next;
    (pNVar2->super_KeyNode).super_NodeBase.next = (NodeBase *)pNVar3;
    internal::UntypedMapIterator::PlusPlus(&__begin0.super_UntypedMapIterator);
    pNVar3 = pNVar2;
  }
  return pNVar3;
}

Assistant:

PROTOBUF_NOINLINE Node* CloneFromOther(const Map& other) {
    Node* head = nullptr;
    for (const auto& [key, value] : other) {
      Node* new_node;
      if constexpr (std::is_base_of_v<MessageLite, mapped_type>) {
        new_node = CreateNode(key);
        new_node->kv.second = value;
      } else {
        new_node = CreateNode(key, value);
      }
      new_node->next = head;
      head = new_node;
    }
    return head;
  }